

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.cc
# Opt level: O2

void dynet::TensorTools::randomize_bernoulli(Tensor *val,real p,real scale)

{
  float *pfVar1;
  uint uVar2;
  runtime_error *this;
  long lVar3;
  float fVar4;
  double dVar5;
  
  if (val->device->type == CPU) {
    pfVar1 = val->v;
    uVar2 = Dim::size(&val->d);
    for (lVar3 = 0; (ulong)uVar2 << 2 != lVar3; lVar3 = lVar3 + 4) {
      dVar5 = std::
              generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                        (rndeng);
      fVar4 = 1.0;
      if ((double)p <= dVar5) {
        fVar4 = 0.0;
      }
      *(float *)((long)pfVar1 + lVar3) = fVar4 * scale;
    }
    return;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"Bad device type");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void TensorTools::randomize_bernoulli(Tensor& val, real p, real scale) {
  bernoulli_distribution distribution(p);
  auto b = [&] {return distribution(*rndeng) * scale;};
  if (val.device->type == DeviceType::CPU) {
    generate(val.v, val.v + val.d.size(), b);
#if HAVE_CUDA
  } else if (val.device->type == DeviceType::GPU) {
    float* t = new float[val.d.size()];
    generate(t, t + val.d.size(), b);
    CUDA_CHECK(cudaMemcpy(val.v, t, sizeof(real) * val.d.size(), cudaMemcpyHostToDevice));
    delete[] t;
#endif
  } else { throw std::runtime_error("Bad device type"); }
}